

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexBenchmarks.hpp
# Opt level: O0

void benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic
               (BenchmarkContext *context)

{
  anon_class_8_1_54a3980d local_120;
  allocator local_111;
  string local_110;
  anon_class_8_1_54a3980d local_f0;
  allocator local_e1;
  string local_e0;
  anon_class_8_1_54a3980d local_c0;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88 [32];
  anon_class_8_1_54a3980d local_68 [3];
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  StorageArray<boost::recursive_mutex> m;
  int64_t n;
  BenchmarkContext *context_local;
  
  m._size = BenchmarkContext::GetIterationsCount(context);
  StorageArray<boost::recursive_mutex>::StorageArray
            ((StorageArray<boost::recursive_mutex> *)local_28,m._size);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"create",&local_49);
  local_68[0].m = (StorageArray<boost::recursive_mutex> *)local_28;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_48,m._size,local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"mutex",&local_89);
  (*context->_vptr_BenchmarkContext[2])(context,local_88,m._size);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"lock",&local_b1);
  local_c0.m = (StorageArray<boost::recursive_mutex> *)local_28;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,&local_b0,m._size,&local_c0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"unlock",&local_e1);
  local_f0.m = (StorageArray<boost::recursive_mutex> *)local_28;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_3_>
            (context,&local_e0,m._size,&local_f0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"destroy",&local_111);
  local_120.m = (StorageArray<boost::recursive_mutex> *)local_28;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_4_>
            (context,&local_110,m._size,&local_120);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  StorageArray<boost::recursive_mutex>::~StorageArray
            ((StorageArray<boost::recursive_mutex> *)local_28);
  return;
}

Assistant:

static void Basic(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<MutexType> m(n);

            context.Profile("create", n, [&]{ m.Construct(); });
            context.MeasureMemory("mutex", n);
            context.Profile("lock", n, [&]{ m.ForEach([](MutexType& m){ m.lock(); }); });
            context.Profile("unlock", n, [&]{ m.ForEach([](MutexType& m){ m.unlock(); }); });
            context.Profile("destroy", n, [&]{ m.Destruct(); });
        }